

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O1

void __thiscall kj::anon_unknown_0::TestCase339::run(TestCase339 *this)

{
  long lVar1;
  long lVar2;
  uchar *puVar3;
  int iVar4;
  char *in_RCX;
  char *pcVar5;
  size_t sVar6;
  size_t sVar7;
  kj *pkVar8;
  ulong uVar9;
  uchar *ptrCopy;
  kj *this_00;
  ulong uVar10;
  DecodeUriOptions in_R8W;
  char *pcVar11;
  bool bVar12;
  ArrayPtr<const_unsigned_char> bytes_00;
  ArrayPtr<const_unsigned_char> bytes_01;
  ArrayPtr<const_unsigned_char> bytes_02;
  ArrayPtr<const_unsigned_char> bytes_03;
  ArrayPtr<const_unsigned_char> bytes_04;
  ArrayPtr<const_char> text;
  ArrayPtr<const_char> text_00;
  ArrayPtr<const_char> text_01;
  ArrayPtr<const_char> text_02;
  ArrayPtr<const_char> text_03;
  ArrayPtr<const_char> text_04;
  ArrayPtr<const_char> text_05;
  ArrayPtr<const_unsigned_char> bytes_05;
  ArrayPtr<const_char> text_06;
  byte bytes [3];
  EncodingResult<kj::Array<unsigned_char>_> local_148;
  undefined2 local_11c;
  undefined1 local_11a;
  String local_118;
  EncodingResult<kj::String> local_f8;
  EncodingResult<kj::String> local_d8;
  EncodingResult<kj::String> local_b8;
  EncodingResult<kj::String> local_98;
  EncodingResult<kj::String> local_78;
  EncodingResult<kj::String> local_58;
  EncodingResult<kj::String> local_38;
  bool errors;
  bool errors_00;
  bool errors_01;
  
  bytes_00.size_ = (size_t)in_RCX;
  bytes_00.ptr = (uchar *)0x3;
  encodeWwwForm((String *)&local_148,(kj *)0x3a5188,bytes_00);
  pcVar5 = (char *)local_148.super_Array<unsigned_char>.size_;
  bVar12 = true;
  if ((char *)local_148.super_Array<unsigned_char>.size_ == (char *)0x4) {
    iVar4 = bcmp(local_148.super_Array<unsigned_char>.ptr,"foo",3);
    bVar12 = iVar4 != 0;
  }
  puVar3 = local_148.super_Array<unsigned_char>.ptr;
  if (local_148.super_Array<unsigned_char>.ptr != (uchar *)0x0) {
    local_148.super_Array<unsigned_char>.ptr = (uchar *)0x0;
    local_148.super_Array<unsigned_char>.size_ = 0;
    pcVar11 = pcVar5;
    (**(local_148.super_Array<unsigned_char>.disposer)->_vptr_ArrayDisposer)
              (local_148.super_Array<unsigned_char>.disposer,puVar3,1,pcVar5,pcVar5,0);
    in_R8W = SUB82(pcVar11,0);
    in_RCX = pcVar5;
  }
  if ((bool)(bVar12 & _::Debug::minSeverity < 3)) {
    in_RCX = "\"failed: expected \" \"encodeWwwForm(\\\"foo\\\") == \\\"foo\\\"\"";
    in_R8W.nulTerminate = true;
    in_R8W.plusToSpace = true;
    _::Debug::log<char_const(&)[47]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/encoding-test.c++"
               ,0x154,ERROR,"\"failed: expected \" \"encodeWwwForm(\\\"foo\\\") == \\\"foo\\\"\"",
               (char (*) [47])"failed: expected encodeWwwForm(\"foo\") == \"foo\"");
  }
  bytes_01.size_ = (size_t)in_RCX;
  bytes_01.ptr = (uchar *)0x7;
  encodeWwwForm((String *)&local_148,(kj *)0x3a2a39,bytes_01);
  pcVar5 = (char *)local_148.super_Array<unsigned_char>.size_;
  bVar12 = true;
  if ((char *)local_148.super_Array<unsigned_char>.size_ == (char *)0x8) {
    iVar4 = bcmp(local_148.super_Array<unsigned_char>.ptr,"foo+bar",7);
    bVar12 = iVar4 != 0;
  }
  puVar3 = local_148.super_Array<unsigned_char>.ptr;
  if (local_148.super_Array<unsigned_char>.ptr != (uchar *)0x0) {
    local_148.super_Array<unsigned_char>.ptr = (uchar *)0x0;
    local_148.super_Array<unsigned_char>.size_ = 0;
    pcVar11 = pcVar5;
    (**(local_148.super_Array<unsigned_char>.disposer)->_vptr_ArrayDisposer)
              (local_148.super_Array<unsigned_char>.disposer,puVar3,1,pcVar5,pcVar5,0);
    in_R8W = SUB82(pcVar11,0);
    in_RCX = pcVar5;
  }
  if ((bool)(bVar12 & _::Debug::minSeverity < 3)) {
    in_RCX = "\"failed: expected \" \"encodeWwwForm(\\\"foo bar\\\") == \\\"foo+bar\\\"\"";
    in_R8W.nulTerminate = true;
    in_R8W.plusToSpace = true;
    _::Debug::log<char_const(&)[55]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/encoding-test.c++"
               ,0x155,ERROR,
               "\"failed: expected \" \"encodeWwwForm(\\\"foo bar\\\") == \\\"foo+bar\\\"\"",
               (char (*) [55])"failed: expected encodeWwwForm(\"foo bar\") == \"foo+bar\"");
  }
  bytes_02.size_ = (size_t)in_RCX;
  bytes_02.ptr = (uchar *)0x2;
  encodeWwwForm((String *)&local_148,(kj *)anon_var_dwarf_18d30f,bytes_02);
  pcVar5 = (char *)local_148.super_Array<unsigned_char>.size_;
  bVar12 = true;
  if ((char *)local_148.super_Array<unsigned_char>.size_ == (char *)0x7) {
    iVar4 = bcmp(local_148.super_Array<unsigned_char>.ptr,"%AB%BA",6);
    bVar12 = iVar4 != 0;
  }
  puVar3 = local_148.super_Array<unsigned_char>.ptr;
  if (local_148.super_Array<unsigned_char>.ptr != (uchar *)0x0) {
    local_148.super_Array<unsigned_char>.ptr = (uchar *)0x0;
    local_148.super_Array<unsigned_char>.size_ = 0;
    pcVar11 = pcVar5;
    (**(local_148.super_Array<unsigned_char>.disposer)->_vptr_ArrayDisposer)
              (local_148.super_Array<unsigned_char>.disposer,puVar3,1,pcVar5,pcVar5,0);
    in_R8W = SUB82(pcVar11,0);
    in_RCX = pcVar5;
  }
  if ((bool)(bVar12 & _::Debug::minSeverity < 3)) {
    in_RCX = "\"failed: expected \" \"encodeWwwForm(\\\"\\\\xab\\\\xba\\\") == \\\"%AB%BA\\\"\"";
    in_R8W.nulTerminate = true;
    in_R8W.plusToSpace = true;
    _::Debug::log<char_const(&)[55]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/encoding-test.c++"
               ,0x156,ERROR,
               "\"failed: expected \" \"encodeWwwForm(\\\"\\\\xab\\\\xba\\\") == \\\"%AB%BA\\\"\"",
               (char (*) [55])"failed: expected encodeWwwForm(\"\\xab\\xba\") == \"%AB%BA\"");
  }
  bytes_03.size_ = (size_t)in_RCX;
  bytes_03.ptr = (uchar *)0x7;
  encodeWwwForm((String *)&local_148,(kj *)"foo",bytes_03);
  pcVar5 = (char *)local_148.super_Array<unsigned_char>.size_;
  bVar12 = true;
  if ((char *)local_148.super_Array<unsigned_char>.size_ == (char *)0xa) {
    iVar4 = bcmp(local_148.super_Array<unsigned_char>.ptr,"foo%00bar",9);
    bVar12 = iVar4 != 0;
  }
  puVar3 = local_148.super_Array<unsigned_char>.ptr;
  if (local_148.super_Array<unsigned_char>.ptr != (uchar *)0x0) {
    local_148.super_Array<unsigned_char>.ptr = (uchar *)0x0;
    local_148.super_Array<unsigned_char>.size_ = 0;
    pcVar11 = pcVar5;
    (**(local_148.super_Array<unsigned_char>.disposer)->_vptr_ArrayDisposer)
              (local_148.super_Array<unsigned_char>.disposer,puVar3,1,pcVar5,pcVar5,0);
    in_R8W = SUB82(pcVar11,0);
    in_RCX = pcVar5;
  }
  if ((bool)(bVar12 & _::Debug::minSeverity < 3)) {
    in_RCX = 
    "\"failed: expected \" \"encodeWwwForm(StringPtr(\\\"foo\\\\0bar\\\", 7)) == \\\"foo%00bar\\\"\""
    ;
    in_R8W.nulTerminate = true;
    in_R8W.plusToSpace = true;
    _::Debug::log<char_const(&)[72]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/encoding-test.c++"
               ,0x157,ERROR,
               "\"failed: expected \" \"encodeWwwForm(StringPtr(\\\"foo\\\\0bar\\\", 7)) == \\\"foo%00bar\\\"\""
               ,(char (*) [72])
                "failed: expected encodeWwwForm(StringPtr(\"foo\\0bar\", 7)) == \"foo%00bar\"");
  }
  bytes_04.size_ = (size_t)in_RCX;
  bytes_04.ptr = (uchar *)0xa;
  encodeWwwForm((String *)&local_148,(kj *)"\'foo\'! (~)",bytes_04);
  pcVar5 = (char *)local_148.super_Array<unsigned_char>.size_;
  bVar12 = true;
  if ((char *)local_148.super_Array<unsigned_char>.size_ == (char *)0x17) {
    iVar4 = bcmp(local_148.super_Array<unsigned_char>.ptr,"%27foo%27%21+%28%7E%29",0x16);
    bVar12 = iVar4 != 0;
  }
  puVar3 = local_148.super_Array<unsigned_char>.ptr;
  if (local_148.super_Array<unsigned_char>.ptr != (uchar *)0x0) {
    local_148.super_Array<unsigned_char>.ptr = (uchar *)0x0;
    local_148.super_Array<unsigned_char>.size_ = 0;
    (**(local_148.super_Array<unsigned_char>.disposer)->_vptr_ArrayDisposer)
              (local_148.super_Array<unsigned_char>.disposer,puVar3,1,pcVar5,pcVar5,0);
    in_R8W = SUB82(pcVar5,0);
  }
  if ((bool)(bVar12 & _::Debug::minSeverity < 3)) {
    in_R8W.nulTerminate = true;
    in_R8W.plusToSpace = true;
    _::Debug::log<char_const(&)[73]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/encoding-test.c++"
               ,0x15a,ERROR,
               "\"failed: expected \" \"encodeWwwForm(\\\"\'foo\'! (~)\\\") == \\\"%27foo%27%21+%28%7E%29\\\"\""
               ,(char (*) [73])
                "failed: expected encodeWwwForm(\"\'foo\'! (~)\") == \"%27foo%27%21+%28%7E%29\"");
  }
  text.size_ = 0x101;
  text.ptr = (char *)0x9;
  decodeBinaryUriComponent(&local_148,(kj *)"foo%20bar",text,in_R8W);
  local_38.super_String.content.disposer = local_148.super_Array<unsigned_char>.disposer;
  local_38.super_String.content.size_ = local_148.super_Array<unsigned_char>.size_;
  local_38.super_String.content.ptr = (char *)local_148.super_Array<unsigned_char>.ptr;
  local_148.super_Array<unsigned_char>.size_ = 0;
  local_148.super_Array<unsigned_char>.ptr = (uchar *)0x0;
  (anonymous_namespace)::expectRes<kj::String,char,8ul>(&local_38,(char (*) [8])0x3a2a39,false);
  pcVar11 = (char *)local_38.super_String.content.size_;
  pcVar5 = local_38.super_String.content.ptr;
  if ((uchar *)local_38.super_String.content.ptr != (uchar *)0x0) {
    local_38.super_String.content.ptr = (char *)0x0;
    local_38.super_String.content.size_ = 0;
    (**(local_38.super_String.content.disposer)->_vptr_ArrayDisposer)
              (local_38.super_String.content.disposer,pcVar5,1,pcVar11,pcVar11,0);
    in_R8W = SUB82(pcVar11,0);
  }
  text_00.size_ = 0x101;
  text_00.ptr = (char *)0x7;
  decodeBinaryUriComponent(&local_148,(kj *)"foo+bar",text_00,in_R8W);
  local_58.super_String.content.disposer = local_148.super_Array<unsigned_char>.disposer;
  local_58.super_String.content.size_ = local_148.super_Array<unsigned_char>.size_;
  local_58.super_String.content.ptr = (char *)local_148.super_Array<unsigned_char>.ptr;
  local_148.super_Array<unsigned_char>.size_ = 0;
  local_148.super_Array<unsigned_char>.ptr = (uchar *)0x0;
  (anonymous_namespace)::expectRes<kj::String,char,8ul>(&local_58,(char (*) [8])0x3a2a39,false);
  sVar7 = local_58.super_String.content.size_;
  pcVar5 = local_58.super_String.content.ptr;
  if ((uchar *)local_58.super_String.content.ptr != (uchar *)0x0) {
    local_58.super_String.content.ptr = (char *)0x0;
    local_58.super_String.content.size_ = 0;
    (**(local_58.super_String.content.disposer)->_vptr_ArrayDisposer)
              (local_58.super_String.content.disposer,pcVar5,1,sVar7,sVar7,0);
    in_R8W = SUB82(sVar7,0);
  }
  text_01.size_ = 0x101;
  text_01.ptr = (char *)0x6;
  decodeBinaryUriComponent(&local_148,(kj *)"%ab%BA",text_01,in_R8W);
  local_78.super_String.content.disposer = local_148.super_Array<unsigned_char>.disposer;
  local_78.super_String.content.size_ = local_148.super_Array<unsigned_char>.size_;
  local_78.super_String.content.ptr = (char *)local_148.super_Array<unsigned_char>.ptr;
  local_148.super_Array<unsigned_char>.size_ = 0;
  local_148.super_Array<unsigned_char>.ptr = (uchar *)0x0;
  (anonymous_namespace)::expectRes<kj::String,char,3ul>(&local_78,(char (*) [3])0x0,errors);
  sVar7 = local_78.super_String.content.size_;
  pcVar5 = local_78.super_String.content.ptr;
  if ((uchar *)local_78.super_String.content.ptr != (uchar *)0x0) {
    local_78.super_String.content.ptr = (char *)0x0;
    local_78.super_String.content.size_ = 0;
    (**(local_78.super_String.content.disposer)->_vptr_ArrayDisposer)
              (local_78.super_String.content.disposer,pcVar5,1,sVar7,sVar7,0);
    in_R8W = SUB82(sVar7,0);
  }
  text_02.size_ = 0x101;
  text_02.ptr = &DAT_00000008;
  decodeBinaryUriComponent(&local_148,(kj *)"foo%1xxx",text_02,in_R8W);
  local_98.super_String.content.disposer = local_148.super_Array<unsigned_char>.disposer;
  local_98.super_String.content.size_ = local_148.super_Array<unsigned_char>.size_;
  local_98.super_String.content.ptr = (char *)local_148.super_Array<unsigned_char>.ptr;
  local_148.super_Array<unsigned_char>.size_ = 0;
  local_148.super_Array<unsigned_char>.ptr = (uchar *)0x0;
  (anonymous_namespace)::expectRes<kj::String,char,8ul>(&local_98,(char (*) [8])"foo\x01xxx",true);
  sVar7 = local_98.super_String.content.size_;
  pcVar5 = local_98.super_String.content.ptr;
  if ((uchar *)local_98.super_String.content.ptr != (uchar *)0x0) {
    local_98.super_String.content.ptr = (char *)0x0;
    local_98.super_String.content.size_ = 0;
    (**(local_98.super_String.content.disposer)->_vptr_ArrayDisposer)
              (local_98.super_String.content.disposer,pcVar5,1,sVar7,sVar7,0);
    in_R8W = SUB82(sVar7,0);
  }
  text_03.size_ = 0x101;
  text_03.ptr = (char *)0x5;
  decodeBinaryUriComponent(&local_148,(kj *)"foo%1",text_03,in_R8W);
  local_b8.super_String.content.disposer = local_148.super_Array<unsigned_char>.disposer;
  local_b8.super_String.content.size_ = local_148.super_Array<unsigned_char>.size_;
  local_b8.super_String.content.ptr = (char *)local_148.super_Array<unsigned_char>.ptr;
  local_148.super_Array<unsigned_char>.size_ = 0;
  local_148.super_Array<unsigned_char>.ptr = (uchar *)0x0;
  (anonymous_namespace)::expectRes<kj::String,char,5ul>(&local_b8,(char (*) [5])"foo\x01",true);
  sVar7 = local_b8.super_String.content.size_;
  pcVar5 = local_b8.super_String.content.ptr;
  if ((uchar *)local_b8.super_String.content.ptr != (uchar *)0x0) {
    local_b8.super_String.content.ptr = (char *)0x0;
    local_b8.super_String.content.size_ = 0;
    (**(local_b8.super_String.content.disposer)->_vptr_ArrayDisposer)
              (local_b8.super_String.content.disposer,pcVar5,1,sVar7,sVar7,0);
    in_R8W = SUB82(sVar7,0);
  }
  text_04.size_ = 0x101;
  text_04.ptr = (char *)0x7;
  decodeBinaryUriComponent(&local_148,(kj *)"foo%xxx",text_04,in_R8W);
  local_d8.super_String.content.disposer = local_148.super_Array<unsigned_char>.disposer;
  local_d8.super_String.content.size_ = local_148.super_Array<unsigned_char>.size_;
  local_d8.super_String.content.ptr = (char *)local_148.super_Array<unsigned_char>.ptr;
  local_148.super_Array<unsigned_char>.size_ = 0;
  local_148.super_Array<unsigned_char>.ptr = (uchar *)0x0;
  (anonymous_namespace)::expectRes<kj::String,char,7ul>(&local_d8,(char (*) [7])"fooxxx",errors_00);
  sVar7 = local_d8.super_String.content.size_;
  pcVar5 = local_d8.super_String.content.ptr;
  if ((uchar *)local_d8.super_String.content.ptr != (uchar *)0x0) {
    local_d8.super_String.content.ptr = (char *)0x0;
    local_d8.super_String.content.size_ = 0;
    (**(local_d8.super_String.content.disposer)->_vptr_ArrayDisposer)
              (local_d8.super_String.content.disposer,pcVar5,1,sVar7,sVar7,0);
    in_R8W = SUB82(sVar7,0);
  }
  text_05.size_ = 0x101;
  text_05.ptr = &DAT_00000004;
  sVar6 = 0x101;
  decodeBinaryUriComponent(&local_148,(kj *)"foo%",text_05,in_R8W);
  local_f8.super_String.content.disposer = local_148.super_Array<unsigned_char>.disposer;
  local_f8.super_String.content.size_ = local_148.super_Array<unsigned_char>.size_;
  local_f8.super_String.content.ptr = (char *)local_148.super_Array<unsigned_char>.ptr;
  local_148.super_Array<unsigned_char>.size_ = 0;
  local_148.super_Array<unsigned_char>.ptr = (uchar *)0x0;
  (anonymous_namespace)::expectRes<kj::String,char,4ul>(&local_f8,(char (*) [4])0x1,errors_01);
  sVar7 = local_f8.super_String.content.size_;
  pcVar5 = local_f8.super_String.content.ptr;
  if ((uchar *)local_f8.super_String.content.ptr != (uchar *)0x0) {
    local_f8.super_String.content.ptr = (char *)0x0;
    local_f8.super_String.content.size_ = 0;
    sVar6 = sVar7;
    (**(local_f8.super_String.content.disposer)->_vptr_ArrayDisposer)
              (local_f8.super_String.content.disposer,pcVar5,1,sVar7,sVar7,0);
    in_R8W = SUB82(sVar6,0);
    sVar6 = sVar7;
  }
  local_11a = 0x38;
  local_11c = 0x220c;
  bytes_05.size_ = sVar6;
  bytes_05.ptr = (uchar *)0x3;
  encodeWwwForm(&local_118,(kj *)&local_11c,bytes_05);
  this_00 = (kj *)local_118.content.size_;
  if ((kj *)local_118.content.size_ != (kj *)0x0) {
    this_00 = (kj *)local_118.content.ptr;
  }
  pkVar8 = (kj *)0x0;
  if ((kj *)local_118.content.size_ != (kj *)0x0) {
    pkVar8 = (kj *)(local_118.content.size_ + -1);
  }
  text_06.size_ = 0x100;
  text_06.ptr = (char *)pkVar8;
  decodeBinaryUriComponent(&local_148,this_00,text_06,in_R8W);
  sVar7 = local_148.super_Array<unsigned_char>.size_;
  puVar3 = local_148.super_Array<unsigned_char>.ptr;
  if ((local_148.super_Array<unsigned_char>.size_ == 3) &&
     ((kj)*local_148.super_Array<unsigned_char>.ptr == local_11c._0_1_)) {
    uVar9 = 0;
    do {
      if (uVar9 == 2) {
        uVar10 = 3;
        break;
      }
      lVar1 = uVar9 + 1;
      uVar10 = uVar9 + 1;
      lVar2 = uVar9 + 1;
      uVar9 = uVar10;
    } while (*(kj *)(local_148.super_Array<unsigned_char>.ptr + lVar1) ==
             *(kj *)((long)&local_11c + lVar2));
    bVar12 = 2 < uVar10;
  }
  else {
    bVar12 = false;
  }
  if ((kj *)local_148.super_Array<unsigned_char>.ptr != (kj *)0x0) {
    local_148.super_Array<unsigned_char>.ptr = (uchar *)0x0;
    local_148.super_Array<unsigned_char>.size_ = 0;
    (**(local_148.super_Array<unsigned_char>.disposer)->_vptr_ArrayDisposer)
              (local_148.super_Array<unsigned_char>.disposer,puVar3,1,sVar7,sVar7,0);
  }
  sVar7 = local_118.content.size_;
  pcVar5 = local_118.content.ptr;
  if ((kj *)local_118.content.ptr != (kj *)0x0) {
    local_118.content.ptr = (char *)0x0;
    local_118.content.size_ = 0;
    (**(local_118.content.disposer)->_vptr_ArrayDisposer)
              (local_118.content.disposer,pcVar5,1,sVar7,sVar7,0);
  }
  if (!bVar12 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[82]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/encoding-test.c++"
               ,0x168,ERROR,
               "\"failed: expected \" \"decodeBinaryUriComponent(encodeWwwForm(bytes), options) == bytes\""
               ,(char (*) [82])
                "failed: expected decodeBinaryUriComponent(encodeWwwForm(bytes), options) == bytes")
    ;
  }
  return;
}

Assistant:

TEST(Async, SeparateFulfillerCanceled) {
  auto pair = newPromiseAndFulfiller<void>();

  EXPECT_TRUE(pair.fulfiller->isWaiting());
  pair.promise = nullptr;
  EXPECT_FALSE(pair.fulfiller->isWaiting());
}